

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

int stbi__free_jpeg_components(stbi__jpeg *z,int ncomp,int why)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  int in_EAX;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar4;
  long *in_FS_OFFSET;
  undefined1 auVar5 [12];
  
  if (0 < ncomp) {
    lVar1 = *in_FS_OFFSET + -0x430;
    lVar4 = 0;
    do {
      if (*(long *)((long)&z->img_comp[0].raw_data + lVar4) != 0) {
        (*(code *)in_FS_OFFSET[-0x85])(lVar1,3,why);
        puVar2 = (undefined8 *)((long)&z->img_comp[0].data + lVar4);
        *puVar2 = 0;
        puVar2[1] = 0;
        why = extraout_EDX;
      }
      if (*(long *)((long)&z->img_comp[0].raw_coeff + lVar4) != 0) {
        (*(code *)in_FS_OFFSET[-0x85])(lVar1,3);
        *(undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar4) = 0;
        *(undefined8 *)((long)&z->img_comp[0].coeff + lVar4) = 0;
        why = extraout_EDX_00;
      }
      lVar3 = *(long *)((long)&z->img_comp[0].linebuf + lVar4);
      auVar5._8_4_ = why;
      auVar5._0_8_ = lVar3;
      if (lVar3 != 0) {
        auVar5 = (*(code *)in_FS_OFFSET[-0x85])(lVar1,3);
        *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar4) = 0;
      }
      why = auVar5._8_4_;
      in_EAX = auVar5._0_4_;
      lVar4 = lVar4 + 0x60;
    } while ((ulong)(uint)ncomp * 0x60 != lVar4);
  }
  return in_EAX;
}

Assistant:

static int stbi__free_jpeg_components(stbi__jpeg *z, int ncomp, int why)
{
   int i;
   for (i=0; i < ncomp; ++i) {
      if (z->img_comp[i].raw_data) {
         STBI_FREE(z->img_comp[i].raw_data);
         z->img_comp[i].raw_data = NULL;
         z->img_comp[i].data = NULL;
      }
      if (z->img_comp[i].raw_coeff) {
         STBI_FREE(z->img_comp[i].raw_coeff);
         z->img_comp[i].raw_coeff = 0;
         z->img_comp[i].coeff = 0;
      }
      if (z->img_comp[i].linebuf) {
         STBI_FREE(z->img_comp[i].linebuf);
         z->img_comp[i].linebuf = NULL;
      }
   }
   return why;
}